

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisualizerBuffer.cpp
# Opt level: O0

ssize_t __thiscall VisualizerBuffer::write(VisualizerBuffer *this,int __fd,void *__buf,size_t __n)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  pointer pfVar3;
  undefined4 in_register_00000034;
  unsigned_long toWriteSamples;
  unsigned_long local_38;
  unsigned_long toWrite;
  pointer dest;
  unsigned_long ignoring;
  size_t amount_local;
  float *buf_local;
  VisualizerBuffer *this_local;
  
  amount_local = CONCAT44(in_register_00000034,__fd);
  ignoring = (unsigned_long)__buf;
  buf_local = (float *)this;
  puVar2 = std::min<unsigned_long>(&this->mIgnoreCounter,&ignoring);
  dest = (pointer)*puVar2;
  ignoring = ignoring - (long)dest;
  this->mIgnoreCounter = this->mIgnoreCounter - (long)dest;
  toWrite = (unsigned_long)this;
  if (ignoring != 0) {
    amount_local = (long)dest * 8 + amount_local;
    pfVar3 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->mBufferData);
    toWrite = (unsigned_long)(pfVar3 + this->mIndex * 2);
    while( true ) {
      toWriteSamples = this->mBufferSize - this->mIndex;
      puVar2 = std::min<unsigned_long>(&toWriteSamples,&ignoring);
      uVar1 = *puVar2;
      local_38 = uVar1;
      std::copy_n<float*,unsigned_long,float*>((float *)amount_local,uVar1 * 2,(float *)toWrite);
      ignoring = ignoring - local_38;
      this->mIndex = local_38 + this->mIndex;
      if (this->mIndex == this->mBufferSize) {
        this->mIndex = 0;
        toWrite = (unsigned_long)
                  std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->mBufferData);
      }
      else {
        toWrite = uVar1 * 8 + toWrite;
      }
      if (ignoring == 0) break;
      amount_local = uVar1 * 8 + amount_local;
    }
  }
  return toWrite;
}

Assistant:

void VisualizerBuffer::write(float buf[], size_t amount) {

    auto ignoring = std::min(mIgnoreCounter, amount);
    amount -= ignoring;
    mIgnoreCounter -= ignoring;

    if (amount) {
        // adjust buffer pointer skip whatever we ignored
        buf += ignoring * 2;

        auto dest = mBufferData.get() + (mIndex * 2);

        // this loop should only iterate two times max, if not then the amount is
        // greater than the buffer's capacity and the caller did not call
        // beginWrite first. Iterating more than twice is inefficient, since we
        // are overwriting what we just copied.
        for (;;) {
            auto const toWrite = std::min(mBufferSize - mIndex, amount);
            auto const toWriteSamples = toWrite * 2;
            std::copy_n(buf, toWriteSamples, dest);
            amount -= toWrite;
            mIndex += toWrite;

            if (mIndex == mBufferSize) {
                mIndex = 0;
                dest = mBufferData.get();
            } else {
                dest += toWriteSamples;
            }

            if (amount > 0) {
                buf += toWriteSamples;
            } else {
                break;
            }
        }

    }

}